

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O2

KBOOL KDIS::UTILS::IsMachineBigEndian(void)

{
  int iVar1;
  bool bVar2;
  
  if ((IsMachineBigEndian()::conv == '\0') &&
     (iVar1 = __cxa_guard_acquire(&IsMachineBigEndian()::conv), iVar1 != 0)) {
    IsMachineBigEndian::conv.m_Value = 1;
    __cxa_guard_release(&IsMachineBigEndian()::conv);
  }
  bVar2 = IsMachineBigEndian::conv.field_0.m_Octs[0] != '\x01';
  return bVar2;
}

Assistant:

static inline KBOOL IsMachineBigEndian()
{
    static KUINT16 ui = 0x01;

    static NetToKUINT16 conv( ui, false );

    if( conv.m_Octs[0] == 0x01 )
    {
        return false;
    }
    else
    {
        return true;
    }
}